

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall
soul::AST::UsingDeclaration::UsingDeclaration
          (UsingDeclaration *this,Context *c,Identifier usingName,
          pool_ptr<soul::AST::Expression> *target)

{
  ExpressionKind EVar1;
  SourceCodeText *pSVar2;
  Expression *pEVar3;
  
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject._vptr_ASTObject
       = (_func_int **)&PTR__ASTObject_002d4778;
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject.objectType =
       UsingDeclaration;
  pSVar2 = (c->location).sourceCode.object;
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject.context.
  location.sourceCode.object = pSVar2;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject.context.
  location.location.data = (c->location).location.data;
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject.context.
  parentScope = c->parentScope;
  (this->super_TypeDeclarationBase).super_Expression.kind = type;
  (this->super_TypeDeclarationBase).name.name = usingName.name;
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject._vptr_ASTObject
       = (_func_int **)&PTR__UsingDeclaration_002d5bd0;
  pEVar3 = target->object;
  (this->targetType).object = pEVar3;
  if ((pEVar3 != (Expression *)0x0) &&
     ((pEVar3 = (this->targetType).object, pEVar3 == (Expression *)0x0 ||
      ((EVar1 = pEVar3->kind, EVar1 != type && (EVar1 != unknown)))))) {
    throwInternalCompilerError
              ("targetType == nullptr || isPossiblyType (targetType)","UsingDeclaration",0x5ad);
  }
  return;
}

Assistant:

UsingDeclaration (const Context& c, Identifier usingName, pool_ptr<Expression> target)
            : TypeDeclarationBase (ObjectType::UsingDeclaration, c, usingName), targetType (target)
        {
            SOUL_ASSERT (targetType == nullptr || isPossiblyType (targetType));
        }